

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O3

size_t fdb_estimate_space_used(fdb_file_handle *fhandle)

{
  uint uVar1;
  fdb_kvs_handle *handle;
  filemgr *file;
  uint64_t uVar2;
  uint64_t uVar3;
  size_t sVar4;
  
  if (fhandle != (fdb_file_handle *)0x0) {
    handle = fhandle->root;
    fdb_check_file_reopen(handle,(file_status_t *)0x0);
    fdb_sync_db_header(handle);
    file = handle->file;
    uVar2 = _kvs_stat_get_sum(file,KVS_STAT_DATASIZE);
    uVar3 = _kvs_stat_get_sum(file,KVS_STAT_NLIVENODES);
    uVar1 = (handle->config).blocksize;
    sVar4 = wal_get_datasize(handle->file);
    sVar4 = sVar4 + uVar2 + uVar1 * uVar3;
    if ((handle->config).bottom_up_index_build == true) {
      sVar4 = sVar4 + (handle->fhandle->root->bub_ctx).space_used;
    }
    return sVar4;
  }
  return 0;
}

Assistant:

LIBFDB_API
size_t fdb_estimate_space_used(fdb_file_handle *fhandle)
{
    size_t ret = 0;
    size_t datasize;
    size_t nlivenodes;
    fdb_kvs_handle *handle = NULL;
    struct filemgr *file;

    if (!fhandle) {
        return 0;
    }

    handle = fhandle->root;

    fdb_check_file_reopen(handle, NULL);
    fdb_sync_db_header(handle);

    file = handle->file;

    datasize = _kvs_stat_get_sum(file, KVS_STAT_DATASIZE);
    nlivenodes = _kvs_stat_get_sum(file, KVS_STAT_NLIVENODES);

    ret = datasize;
    ret += nlivenodes * handle->config.blocksize;
    ret += wal_get_datasize(handle->file);

    if (handle->config.bottom_up_index_build) {
        ret += handle->fhandle->root->bub_ctx.space_used;
    }

    return ret;
}